

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdPatternBitmapColor::~MthdPatternBitmapColor(MthdPatternBitmapColor *this)

{
  MthdPatternBitmapColor *this_local;
  
  ~MthdPatternBitmapColor(this);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			struct pgraph_color c = pgraph_expand_color(&exp, val);
			exp.pattern_mono_rgb[which] = c.r << 20 | c.g << 10 | c.b;
			exp.pattern_mono_a[which] = c.a;
		} else if (cls == 0x18) {
			nv04_pgraph_set_pattern_mono_color_nv01(&exp, which, val);
		} else {
			exp.pattern_mono_color[which] = val;
		}
	}